

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkPrintDistrib(Wlc_Ntk_t *p,int fTwoSides,int fVerbose)

{
  ushort uVar1;
  Abc_Nam_t *p_00;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_01;
  Wlc_Ntk_t *p_02;
  Wlc_Ntk_t *p_03;
  Vec_Wrd_t *pVVar5;
  Wlc_Obj_t *p_04;
  Wlc_Obj_t *pWVar6;
  Wlc_Obj_t *pWVar7;
  Vec_Wrd_t *pVVar8;
  word wVar9;
  char *pcVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  char *pcVar18;
  Wlc_Ntk_t *pWVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  word wVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  double dVar27;
  int nObjs [2] [60];
  
  iVar16 = 0;
  memset(nObjs,0,0x1e0);
  pWVar19 = (Wlc_Ntk_t *)0x3c;
  p_01 = Vec_IntStart(0x3c);
  bVar24 = (p->vPos).nSize != 2;
  bVar25 = fTwoSides == 0;
  if (!bVar25 && !bVar24) {
    pWVar19 = p;
    Wlc_NtkCollectStats(p,nObjs);
  }
  p_02 = (Wlc_Ntk_t *)Vec_PtrStart((int)pWVar19);
  p_03 = (Wlc_Ntk_t *)Vec_PtrStart((int)pWVar19);
  for (; iVar16 != 0x3c; iVar16 = iVar16 + 1) {
    pVVar5 = Vec_WrdAlloc((int)pWVar19);
    pWVar19 = p_02;
    Vec_PtrWriteEntry((Vec_Ptr_t *)p_02,iVar16,pVVar5);
  }
  for (iVar16 = 0; iVar16 != 0x3c; iVar16 = iVar16 + 1) {
    pVVar5 = Vec_WrdAlloc((int)pWVar19);
    pWVar19 = p_03;
    Vec_PtrWriteEntry((Vec_Ptr_t *)p_03,iVar16,pVVar5);
  }
  uVar20 = 1;
  wVar23 = 0;
  iVar16 = 0;
  pWVar7 = (Wlc_Obj_t *)0x0;
  do {
    if (p->iObj <= (int)uVar20) {
      if ((iVar16 != 0) && (0 < (p->vNameIds).nSize)) {
        printf("Warning: %d objects of the design have non-zero-based ranges.\n");
        uVar22 = ((long)pWVar7 - (long)p->pObjs) / 0x18;
        p_00 = p->pManName;
        iVar16 = Vec_IntEntry(&p->vNameIds,(int)uVar22);
        pcVar10 = Abc_NamStr(p_00,iVar16);
        iVar15 = pWVar7->End - pWVar7->Beg;
        iVar16 = -iVar15;
        if (0 < iVar15) {
          iVar16 = iVar15;
        }
        printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",
               uVar22 & 0xffffffff,pcVar10,(ulong)(iVar16 + 1));
      }
      pcVar10 = "";
      pcVar18 = "     Left Share Right";
      if (bVar25 || bVar24) {
        pcVar18 = "";
      }
      printf("ID  :  name  occurrence%s    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n"
             ,pcVar18);
      pcVar18 = "-";
      for (uVar22 = 0; uVar22 != 0x3c; uVar22 = uVar22 + 1) {
        iVar16 = (int)uVar22;
        pVVar5 = (Vec_Wrd_t *)Vec_PtrEntry((Vec_Ptr_t *)p_02,iVar16);
        pVVar8 = (Vec_Wrd_t *)Vec_PtrEntry((Vec_Ptr_t *)p_03,iVar16);
        if (p->nObjs[uVar22] != 0) {
          printf("%2d  :  %-8s  %6d",uVar22 & 0xffffffff,Wlc_Names[uVar22]);
          if (!bVar25 && !bVar24) {
            if (uVar22 == 1) {
              iVar15 = Wlc_NtkCountRealPis(p);
            }
            else {
              iVar15 = p->nObjs[uVar22];
            }
            printf("   ");
            uVar20 = nObjs[0][uVar22];
            printf("%6d",(ulong)uVar20);
            uVar2 = nObjs[1][uVar22];
            printf("%6d",(ulong)((uVar20 - iVar15) + uVar2));
            printf("%6d",(ulong)uVar2);
          }
          uVar20 = Vec_IntEntry(p_01,iVar16);
          printf("%8d ",(ulong)uVar20);
          Wlc_NtkPrintDistribSortOne((Vec_Ptr_t *)p_02,(Vec_Ptr_t *)p_03,iVar16);
          for (uVar20 = 0; (int)uVar20 < pVVar5->nSize; uVar20 = uVar20 + 1) {
            wVar23 = Vec_WrdEntry(pVVar5,uVar20);
            if (((((uVar20 / 6) * 6 + 5 == uVar20) && (0x3ffffffffff < wVar23)) ||
                (((~uVar20 & 7) == 0 && (wVar23 < 0x40000000000)))) &&
               (printf("\n                                "), !bVar25 && !bVar24)) {
              printf("                     ");
            }
            uVar4 = (uint)(wVar23 >> 0x15) & 0x1fffff;
            uVar2 = (uint)wVar23 & 0x1fffff;
            wVar9 = Vec_WrdEntry(pVVar8,uVar20);
            printf("(%d)",wVar9 & 0xffffffff);
            iVar16 = Abc_LitIsCompl(uVar2);
            pcVar17 = pcVar18;
            if (iVar16 == 0) {
              pcVar17 = pcVar10;
            }
            uVar2 = Abc_Lit2Var(uVar2);
            printf("%s%d",pcVar17,(ulong)uVar2);
            if ((wVar23 >> 0x15 & 0x1fffff) != 0) {
              iVar16 = Abc_LitIsCompl(uVar4);
              pcVar17 = pcVar18;
              if (iVar16 == 0) {
                pcVar17 = pcVar10;
              }
              uVar2 = Abc_Lit2Var(uVar4);
              printf("=%s%d",pcVar17,(ulong)uVar2);
            }
            if (0x3ffffffffff < wVar23) {
              uVar2 = (uint)(wVar23 >> 0x20);
              iVar16 = Abc_LitIsCompl(uVar2 >> 10);
              pcVar17 = pcVar18;
              if (iVar16 == 0) {
                pcVar17 = pcVar10;
              }
              uVar2 = Abc_Lit2Var(uVar2 >> 10);
              printf(".%s%d",pcVar17,(ulong)uVar2);
            }
            putchar(0x20);
          }
          putchar(10);
        }
      }
      Vec_VecFree((Vec_Vec_t *)p_02);
      Vec_VecFree((Vec_Vec_t *)p_03);
      Vec_IntFree(p_01);
      return;
    }
    p_04 = Wlc_NtkObj(p,uVar20);
    uVar2 = Wlc_ObjSign(p_04);
    if (0x1fffff < uVar2) {
      iVar3 = p_04->End - p_04->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",(ulong)uVar20,
             (ulong)(iVar15 + 1U),(ulong)(iVar15 + 1U & 0xfffff));
    }
    pWVar6 = p_04;
    if (pWVar7 != (Wlc_Obj_t *)0x0) {
      pWVar6 = pWVar7;
    }
    bVar26 = p_04->Beg != 0;
    if (!bVar26) {
      pWVar6 = pWVar7;
    }
    if ((*(ushort *)p_04 & 0x3d) == 1) {
LAB_00308ebe:
      uVar2 = Wlc_ObjSign(p_04);
      wVar23 = (word)uVar2;
    }
    else {
      uVar2 = *(ushort *)p_04 & 0x3f;
      if (uVar2 < 0x36) {
        if ((0x24000007408080U >> uVar2 & 1) == 0) {
          if ((0x800040UL >> uVar2 & 1) != 0) goto LAB_00308ebe;
          goto LAB_00308fef;
        }
      }
      else {
LAB_00308fef:
        uVar2 = p_04->nFanins;
        if (uVar2 != 1) {
          if (uVar2 == 0) {
            pcVar10 = Wlc_ObjName(p,uVar20);
            printf("Object %d with name \"%s\" has type 0. Looks like it was declared by not defined...\n"
                   ,(ulong)uVar20,pcVar10);
          }
          else {
            if ((int)uVar2 < 2) {
              __assert_fail("Wlc_ObjFaninNum(pObj) >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                            ,0x22d,"void Wlc_NtkPrintDistrib(Wlc_Ntk_t *, int, int)");
            }
            uVar2 = Wlc_ObjSign(p_04);
            piVar11 = Wlc_ObjFanins(p_04);
            if (*piVar11 == 0) {
              uVar22 = 0;
            }
            else {
              pWVar7 = Wlc_ObjFanin0(p,p_04);
              uVar4 = Wlc_ObjSign(pWVar7);
              uVar22 = (ulong)uVar4 << 0x15;
            }
            piVar11 = Wlc_ObjFanins(p_04);
            if (piVar11[1] == 0) {
              uVar12 = 0;
            }
            else {
              pWVar7 = Wlc_ObjFanin1(p,p_04);
              uVar4 = Wlc_ObjSign(pWVar7);
              uVar12 = (ulong)uVar4 << 0x2a;
            }
            wVar23 = (ulong)uVar2 | uVar22 | uVar12;
          }
          goto LAB_00308f16;
        }
      }
      uVar2 = Wlc_ObjSign(p_04);
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      uVar4 = Wlc_ObjSign(pWVar7);
      wVar23 = (ulong)uVar2 | (ulong)uVar4 << 0x15;
    }
LAB_00308f16:
    iVar16 = iVar16 + (uint)bVar26;
    uVar1 = *(ushort *)p_04;
    pVVar5 = (Vec_Wrd_t *)Vec_PtrEntry((Vec_Ptr_t *)p_02,uVar1 & 0x3f);
    pVVar8 = (Vec_Wrd_t *)Vec_PtrEntry((Vec_Ptr_t *)p_03,uVar1 & 0x3f);
    for (lVar21 = 0; iVar15 = (int)lVar21, iVar15 < pVVar5->nSize; lVar21 = lVar21 + 1) {
      wVar9 = Vec_WrdEntry(pVVar5,iVar15);
      if (wVar9 == wVar23) {
        if (pVVar8->nSize <= iVar15) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1e0,"word Vec_WrdAddToEntry(Vec_Wrd_t *, int, word)");
        }
        pVVar8->pArray[lVar21] = pVVar8->pArray[lVar21] + 1;
        goto LAB_00308f95;
      }
    }
    Vec_WrdPush(pVVar5,wVar23);
    Vec_WrdPush(pVVar8,1);
LAB_00308f95:
    switch(*(ushort *)p_04 & 0x3f) {
    case 8:
      iVar3 = p_04->End - p_04->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = (p_04->nFanins - 2) * (iVar15 * 3 + 3);
      iVar3 = 8;
      break;
    case 9:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      iVar14 = p_04->End - p_04->Beg;
      iVar15 = -iVar14;
      if (0 < iVar14) {
        iVar15 = iVar14;
      }
      iVar14 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar3 + 1;
      if (iVar14 <= iVar3 + 1) {
        iVar15 = iVar14;
      }
      iVar15 = iVar15 * 3;
      iVar3 = 9;
      break;
    case 10:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar7->End - pWVar7->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 10;
      break;
    case 0xb:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar7->End - pWVar7->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 0xb;
      break;
    case 0xc:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar7->End - pWVar7->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 0xc;
      break;
    case 0xd:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar7->End - pWVar7->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 0xd;
      break;
    case 0xe:
      iVar15 = p_04->End - p_04->Beg;
      iVar3 = -iVar15;
      if (0 < iVar15) {
        iVar3 = iVar15;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar15 = pWVar7->End - pWVar7->Beg;
      iVar14 = -iVar15;
      if (0 < iVar15) {
        iVar14 = iVar15;
      }
      iVar13 = p_04->End - p_04->Beg;
      iVar15 = -iVar13;
      if (0 < iVar13) {
        iVar15 = iVar13;
      }
      iVar13 = Abc_Base2Log(iVar15 + 1);
      iVar15 = iVar14 + 1;
      if (iVar13 <= iVar14 + 1) {
        iVar15 = iVar13;
      }
      iVar15 = (iVar3 * 3 + 3) * iVar15;
      iVar3 = 0xe;
      break;
    case 0xf:
      iVar3 = 0xf;
      goto LAB_00309434;
    case 0x10:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 + 1;
      iVar3 = 0x10;
      break;
    case 0x11:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 + 1;
      iVar3 = 0x11;
      break;
    case 0x12:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 3 + 3;
      iVar3 = 0x12;
      break;
    case 0x13:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 + 1;
      iVar3 = 0x13;
      break;
    case 0x14:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 + 1;
      iVar3 = 0x14;
      break;
    case 0x15:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 3 + 3;
      iVar3 = 0x15;
      break;
    case 0x16:
      iVar3 = 0x16;
      goto LAB_00309434;
    case 0x17:
      iVar3 = 0x17;
      goto LAB_00309434;
    case 0x18:
      iVar3 = 0x18;
      goto LAB_00309434;
    case 0x19:
      iVar3 = 0x19;
LAB_00309434:
      iVar15 = 0;
      break;
    case 0x1a:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x1a;
      break;
    case 0x1b:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = iVar15 + iVar3 + 1;
      iVar3 = 0x1b;
      break;
    case 0x1c:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = iVar15 + iVar3 + 1;
      iVar3 = 0x1c;
      break;
    case 0x1d:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = iVar15 + iVar3 + 1;
      iVar3 = 0x1d;
      break;
    case 0x1e:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = iVar15 + iVar3 + 3;
      iVar3 = 0x1e;
      break;
    case 0x1f:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 4 + 3;
      iVar3 = 0x1f;
      break;
    case 0x20:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 4 + 3;
      iVar3 = 0x20;
      break;
    case 0x21:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 6;
      iVar3 = 0x21;
      break;
    case 0x22:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 6;
      iVar3 = 0x22;
      break;
    case 0x23:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 6;
      iVar3 = 0x23;
      break;
    case 0x24:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 6;
      iVar3 = 0x24;
      break;
    case 0x25:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x25;
      break;
    case 0x26:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x26;
      break;
    case 0x27:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 3;
      iVar3 = 0x27;
      break;
    case 0x28:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x28;
      break;
    case 0x29:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar3 = 0x29;
      break;
    case 0x2a:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 3;
      iVar3 = 0x2a;
      break;
    case 0x2b:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 9 + 9;
      iVar3 = 0x2b;
      break;
    case 0x2c:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 9 + 9;
      iVar3 = 0x2c;
      break;
    case 0x2d:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 9 + 9);
      iVar3 = 0x2d;
      break;
    case 0x2e:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar13 = pWVar7->End - pWVar7->Beg;
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 0xd + 0xd) + iVar14 * -0x13 + -9;
      iVar3 = 0x2e;
      break;
    case 0x2f:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar13 = pWVar7->End - pWVar7->Beg;
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 0xd + 0xd) + iVar14 * -7 + -9;
      iVar3 = 0x2f;
      break;
    case 0x30:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar13 = pWVar7->End - pWVar7->Beg;
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 0xd + 0xd) + iVar14 * -7 + -9;
      iVar3 = 0x30;
      break;
    case 0x31:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      dVar27 = pow((double)(iVar15 + 1),(double)(iVar3 + 1));
      iVar15 = (int)dVar27 * 10;
      iVar3 = 0x31;
      break;
    case 0x32:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      iVar15 = iVar15 * 4 + 4;
      iVar3 = 0x32;
      break;
    case 0x33:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar13 = pWVar7->End - pWVar7->Beg;
      iVar14 = -iVar13;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      iVar15 = ((uint)((iVar3 + 1) * (iVar15 * 0xb + 0xb)) >> 3) + (iVar14 * 5 + 5U >> 1) + -5;
      iVar3 = 0x33;
      break;
    case 0x34:
      pWVar7 = Wlc_ObjFanin0(p,p_04);
      iVar3 = pWVar7->End - pWVar7->Beg;
      iVar15 = -iVar3;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      pWVar7 = Wlc_ObjFanin1(p,p_04);
      iVar14 = pWVar7->End - pWVar7->Beg;
      iVar3 = -iVar14;
      if (0 < iVar14) {
        iVar3 = iVar14;
      }
      iVar15 = (iVar3 + 1) * (iVar15 * 5 + 5);
      iVar3 = 0x34;
      break;
    default:
      goto switchD_00308fbb_default;
    }
    Vec_IntAddToEntry(p_01,iVar3,iVar15);
switchD_00308fbb_default:
    uVar20 = uVar20 + 1;
    pWVar7 = pWVar6;
  } while( true );
}

Assistant:

void Wlc_NtkPrintDistrib( Wlc_Ntk_t * p, int fTwoSides, int fVerbose )
{
    int nObjs[2][WLC_OBJ_NUMBER] = {{0}}; // counter of objects of each type
    Wlc_Obj_t * pObj, * pObjRange = NULL; int nCountRange = 0;
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( WLC_OBJ_NUMBER );
    word Sign = 0;
    int i, k, s, s0, s1;
    if ( Wlc_NtkPoNum(p) != 2 )
        fTwoSides = 0;
    if ( fTwoSides )
        Wlc_NtkCollectStats( p, nObjs );
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( WLC_OBJ_NUMBER );
    vOccurs = Vec_PtrStart( WLC_OBJ_NUMBER );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Wlc_NtkForEachObj( p, pObj, i )
    {
//        char * pName = Wlc_ObjName(p, i);
        if ( Wlc_ObjSign(pObj) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Wlc_ObjRange(pObj), Wlc_ObjRange(pObj) & 0xFFFFF );
        if ( pObj->Beg )
        {
            if ( pObjRange == NULL )
                pObjRange = pObj;
            nCountRange++;
        }
        // 0-input types
        if ( Wlc_ObjIsCi(pObj) || pObj->Type == WLC_OBJ_CONST || pObj->Type == WLC_OBJ_BIT_CONCAT )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), 0, 0 );
        // 1-input types
        else if ( pObj->Type == WLC_OBJ_BUF    || pObj->Type == WLC_OBJ_BIT_SELECT  || pObj->Type == WLC_OBJ_TABLE ||
             pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT || 
             pObj->Type == WLC_OBJ_BIT_NOT     || pObj->Type == WLC_OBJ_LOGIC_NOT   || pObj->Type == WLC_OBJ_ARI_MINUS )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        // 2-input types (including MUX)
        else if ( Wlc_ObjFaninNum(pObj) == 0 )
            printf( "Object %d with name \"%s\" has type 0. Looks like it was declared by not defined...\n", i, Wlc_ObjName(p, i) );
        else if ( Wlc_ObjFaninNum(pObj) == 1 )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        else
        {
            assert( Wlc_ObjFaninNum(pObj) >= 2 );
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjFaninId(pObj, 0) ? Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)) : 0, Wlc_ObjFaninId(pObj, 1) ? Wlc_ObjSign(Wlc_ObjFanin1(p, pObj)) : 0 );
        }
        // add to storage
        Wlc_NtkPrintDistribAddOne( vTypes, vOccurs, pObj->Type, Sign );
        // count the number of AIG nodes
        if ( pObj->Type == WLC_OBJ_MUX )
            Vec_IntAddToEntry( vAnds, WLC_OBJ_MUX,      3 * Wlc_ObjRange(pObj) * (Wlc_ObjFaninNum(pObj) - 2) );
        else if ( pObj->Type == WLC_OBJ_SHIFT_R )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_R,  Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_RA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_RA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_L )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_L,  Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_LA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_LA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_R )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_R, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_L )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_L, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_BIT_NOT )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_AND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_AND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_OR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_OR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_XOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_XOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NAND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NAND,     Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NOR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOR,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NXOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NXOR, 3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_SELECT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SELECT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_CONCAT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_CONCAT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_ZEROPAD )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_ZEROPAD, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_SIGNEXT )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SIGNEXT, 0 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_NOT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_NOT,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_IMPL )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_IMPL,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_AND )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_AND,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_OR )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_OR,         Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_XOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_XOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) + 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_EQU )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_EQU,     4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_NOTEQU )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_NOTEQU,  4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESS )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESS,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MORE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MORE,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESSEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESSEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MOREEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MOREEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_AND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_AND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_OR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_OR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_XOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_XOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NAND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NAND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NOR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NXOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NXOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_ARI_ADD )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_ADD,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SUB )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SUB,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MULTI,    9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_DIVIDE )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_DIVIDE,  13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 19 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + 10 );
        else if ( pObj->Type == WLC_OBJ_ARI_REM )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_REM,     13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_MODULUS )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MODULUS, 13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_POWER ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_POWER,   10 * (int)pow((double)Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)),(double)Wlc_ObjRange(Wlc_ObjFanin0(p, pObj))) );
        else if ( pObj->Type == WLC_OBJ_ARI_MINUS )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MINUS,    4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SQRT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQRT,    11 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 8 + 5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 2 - 5  );
        else if ( pObj->Type == WLC_OBJ_ARI_SQUARE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQUARE,   5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj))  );
    }
    if ( nCountRange && Vec_IntSize(&p->vNameIds) > 0 )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", Wlc_ObjId(p, pObjRange), 
            Abc_NamStr(p->pManName, Wlc_ObjNameId(p, Wlc_ObjId(p, pObjRange))), Wlc_ObjRange(pObjRange), pObjRange->End, pObjRange->Beg );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence%s    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n", fTwoSides ? "     Left Share Right":"" );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d", i, Wlc_Names[i], p->nObjs[i] );
        if ( fTwoSides )
        {
            int nTotal = i == WLC_OBJ_PI ? Wlc_NtkCountRealPis(p) : p->nObjs[i];
            printf( "   " );
            printf( "%6d", nObjs[0][i] );
            printf( "%6d", nObjs[0][i]+nObjs[1][i]-nTotal );
            printf( "%6d", nObjs[1][i] );
        }
        printf( "%8d ", Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Wlc_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Wlc_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
            {
                printf( "\n                                " );
                if ( fTwoSides )
                    printf( "                     " );
            }
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}